

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O0

void __thiscall
CoreML::NeuralNetworkShaper::shapePaddingLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  ShapeConstraint *pSVar1;
  int iVar2;
  string *psVar3;
  mapped_type *pmVar4;
  ShapeRange *pSVar5;
  ShapeRange *pSVar6;
  PaddingLayerParams *from;
  BorderAmounts *pBVar7;
  BorderAmounts_EdgeSizes *pBVar8;
  ShapeRange local_1e0;
  ShapeRange local_1c0;
  ShapeRange local_1a0;
  ShapeRange local_180;
  ShapeRange local_160;
  ShapeRange local_140;
  ShapeRange local_120;
  ShapeRange local_100;
  ShapeRange local_e0;
  uint64 local_b0;
  size_t b;
  size_t t;
  size_t r;
  size_t l;
  PaddingLayerParams padding;
  ShapeRange local_48;
  mapped_type *local_28;
  ShapeConstraint *outputShape;
  ShapeConstraint *inputShape;
  NeuralNetworkLayer *specLayer_local;
  NeuralNetworkShaper *this_local;
  
  inputShape = (ShapeConstraint *)specLayer;
  specLayer_local = (NeuralNetworkLayer *)this;
  psVar3 = Specification::NeuralNetworkLayer::input_abi_cxx11_(specLayer,0);
  outputShape = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
                ::operator[](&this->blobShapes,(key_type *)psVar3);
  psVar3 = Specification::NeuralNetworkLayer::output_abi_cxx11_((NeuralNetworkLayer *)inputShape,0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
           ::operator[](&this->blobShapes,(key_type *)psVar3);
  local_28 = pmVar4;
  psVar3 = Specification::NeuralNetworkLayer::output_abi_cxx11_((NeuralNetworkLayer *)inputShape,0);
  ShapeConstraint::setName(pmVar4,psVar3);
  pmVar4 = local_28;
  pSVar5 = ShapeConstraint::sequenceRange(local_28);
  pSVar6 = ShapeConstraint::sequenceRange(outputShape);
  ShapeRange::intersect(&local_48,pSVar5,pSVar6);
  ShapeConstraint::updateSequenceRange(pmVar4,&local_48);
  pmVar4 = local_28;
  pSVar5 = ShapeConstraint::batchRange(local_28);
  pSVar6 = ShapeConstraint::batchRange(outputShape);
  ShapeRange::intersect((ShapeRange *)&padding._cached_size_,pSVar5,pSVar6);
  ShapeConstraint::updateBatchRange(pmVar4,(ShapeRange *)&padding._cached_size_);
  pSVar1 = outputShape;
  pSVar5 = ShapeConstraint::sequenceRange(local_28);
  ShapeConstraint::updateSequenceRange(pSVar1,pSVar5);
  pSVar1 = outputShape;
  pSVar5 = ShapeConstraint::batchRange(local_28);
  ShapeConstraint::updateBatchRange(pSVar1,pSVar5);
  pSVar1 = outputShape;
  pSVar5 = ShapeConstraint::channelRange(local_28);
  ShapeConstraint::updateChannelRange(pSVar1,pSVar5);
  from = Specification::NeuralNetworkLayer::padding((NeuralNetworkLayer *)inputShape);
  Specification::PaddingLayerParams::PaddingLayerParams((PaddingLayerParams *)&l,from);
  local_b0 = 0;
  b = 0;
  t = 0;
  r = 0;
  pBVar7 = Specification::PaddingLayerParams::paddingamounts((PaddingLayerParams *)&l);
  iVar2 = Specification::BorderAmounts::borderamounts_size(pBVar7);
  if (iVar2 != 0) {
    pBVar7 = Specification::PaddingLayerParams::paddingamounts((PaddingLayerParams *)&l);
    pBVar8 = Specification::BorderAmounts::borderamounts(pBVar7,0);
    b = Specification::BorderAmounts_EdgeSizes::startedgesize(pBVar8);
    pBVar7 = Specification::PaddingLayerParams::paddingamounts((PaddingLayerParams *)&l);
    pBVar8 = Specification::BorderAmounts::borderamounts(pBVar7,0);
    local_b0 = Specification::BorderAmounts_EdgeSizes::endedgesize(pBVar8);
    pBVar7 = Specification::PaddingLayerParams::paddingamounts((PaddingLayerParams *)&l);
    pBVar8 = Specification::BorderAmounts::borderamounts(pBVar7,1);
    r = Specification::BorderAmounts_EdgeSizes::startedgesize(pBVar8);
    pBVar7 = Specification::PaddingLayerParams::paddingamounts((PaddingLayerParams *)&l);
    pBVar8 = Specification::BorderAmounts::borderamounts(pBVar7,1);
    t = Specification::BorderAmounts_EdgeSizes::endedgesize(pBVar8);
  }
  pmVar4 = local_28;
  pSVar5 = ShapeConstraint::channelRange(local_28);
  pSVar6 = ShapeConstraint::channelRange(outputShape);
  ShapeRange::intersect(&local_e0,pSVar5,pSVar6);
  ShapeConstraint::updateChannelRange(pmVar4,&local_e0);
  pmVar4 = local_28;
  pSVar5 = ShapeConstraint::heightRange(outputShape);
  ShapeRange::operator+(&local_120,pSVar5,b);
  ShapeRange::operator+(&local_100,&local_120,local_b0);
  ShapeConstraint::updateHeightRange(pmVar4,&local_100);
  pmVar4 = local_28;
  pSVar5 = ShapeConstraint::widthRange(outputShape);
  ShapeRange::operator+(&local_160,pSVar5,t);
  ShapeRange::operator+(&local_140,&local_160,r);
  ShapeConstraint::updateWidthRange(pmVar4,&local_140);
  pSVar1 = outputShape;
  pSVar5 = ShapeConstraint::heightRange(local_28);
  ShapeRange::operator-(&local_1a0,pSVar5,b);
  ShapeRange::operator-(&local_180,&local_1a0,local_b0);
  ShapeConstraint::updateHeightRange(pSVar1,&local_180);
  pSVar1 = outputShape;
  pSVar5 = ShapeConstraint::widthRange(local_28);
  ShapeRange::operator-(&local_1e0,pSVar5,r);
  ShapeRange::operator-(&local_1c0,&local_1e0,t);
  ShapeConstraint::updateWidthRange(pSVar1,&local_1c0);
  Specification::PaddingLayerParams::~PaddingLayerParams((PaddingLayerParams *)&l);
  return;
}

Assistant:

void NeuralNetworkShaper::shapePaddingLayer(const Specification::NeuralNetworkLayer& specLayer) {

    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Padding layer " << specLayer.name() << " input shapes (before): " << std::endl;
    std::cout << inputShape;
    std::cout << "Padding layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    outputShape.updateSequenceRange(outputShape.sequenceRange().intersect(inputShape.sequenceRange()));
    outputShape.updateBatchRange(outputShape.batchRange().intersect(inputShape.batchRange()));

    inputShape.updateSequenceRange(outputShape.sequenceRange());
    inputShape.updateBatchRange(outputShape.batchRange());
    inputShape.updateChannelRange(outputShape.channelRange());

    Specification::PaddingLayerParams padding = specLayer.padding();

    size_t l, r, t, b;
    l = r = t = b = 0;
    if (padding.paddingamounts().borderamounts_size() != 0){
        t = (size_t)padding.paddingamounts().borderamounts(0).startedgesize();
        b = (size_t)padding.paddingamounts().borderamounts(0).endedgesize();
        l = (size_t)padding.paddingamounts().borderamounts(1).startedgesize();
        r = (size_t)padding.paddingamounts().borderamounts(1).endedgesize();
    }
    outputShape.updateChannelRange(outputShape.channelRange().intersect(inputShape.channelRange()));
    outputShape.updateHeightRange(inputShape.heightRange() + t + b);
    outputShape.updateWidthRange(inputShape.widthRange() + r + l);
    
    // If a fixed constraint for the output shape emerges later in the network, then we can infer a lower bound for the input shape
    inputShape.updateHeightRange(outputShape.heightRange() - t - b);
    inputShape.updateWidthRange(outputShape.widthRange() - l - r);

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Padding layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Padding layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif

}